

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O1

void CreateBackwardReferencesNH3
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command *commands,size_t *num_commands,size_t *num_literals)

{
  ulong uVar1;
  ulong uVar2;
  uint8_t *puVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  ushort uVar8;
  ushort uVar9;
  uint32_t uVar10;
  ulong uVar11;
  uint8_t *puVar12;
  ulong uVar13;
  byte bVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  size_t sVar21;
  ulong uVar22;
  uint8_t uVar23;
  uint *puVar24;
  uint uVar25;
  long lVar26;
  int iVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  uint32_t uVar33;
  ulong uVar34;
  bool bVar35;
  size_t local_f8;
  ulong local_e8;
  ulong local_e0;
  ulong local_d0;
  ulong local_c8;
  Command *local_c0;
  ulong local_b8;
  uint local_68;
  
  local_f8 = *last_insert_len;
  uVar2 = position + num_bytes;
  uVar11 = (position - 7) + num_bytes;
  if (num_bytes < 8) {
    uVar11 = position;
  }
  lVar26 = 0x200;
  if (params->quality < 9) {
    lVar26 = 0x40;
  }
  if (uVar2 <= position + 8) {
    local_c0 = commands;
LAB_00102dfa:
    *last_insert_len = (local_f8 + uVar2) - position;
    *num_commands = *num_commands + ((long)local_c0 - (long)commands >> 4);
    return;
  }
  uVar31 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  uVar34 = lVar26 + position;
  uVar1 = uVar2 - 7;
  lVar4 = position - 1;
  local_c0 = commands;
  sVar21 = position;
LAB_0010233f:
  local_e8 = uVar2 - sVar21;
  uVar19 = uVar31;
  if (sVar21 < uVar31) {
    uVar19 = sVar21;
  }
  uVar32 = sVar21 & ringbuffer_mask;
  puVar3 = ringbuffer + uVar32;
  uVar23 = ringbuffer[uVar32];
  local_e0 = (ulong)*dist_cache;
  local_b8 = 0x7e4;
  local_68 = (uint)ringbuffer_mask;
  if ((sVar21 - local_e0 < sVar21) &&
     (uVar13 = (ulong)((uint)(sVar21 - local_e0) & local_68), uVar23 == ringbuffer[uVar13])) {
    if (7 < local_e8) {
      uVar15 = local_e8 & 0xfffffffffffffff8;
      puVar12 = ringbuffer + uVar15 + uVar32;
      lVar16 = 0;
      uVar20 = 0;
LAB_001023c6:
      if (*(ulong *)(puVar3 + uVar20 * 8) == *(ulong *)(ringbuffer + uVar20 * 8 + uVar13))
      goto code_r0x001023d7;
      uVar20 = *(ulong *)(ringbuffer + uVar20 * 8 + uVar13) ^ *(ulong *)(puVar3 + uVar20 * 8);
      uVar13 = 0;
      if (uVar20 != 0) {
        for (; (uVar20 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
        }
      }
      uVar20 = (uVar13 >> 3 & 0x1fffffff) - lVar16;
      goto LAB_001029f5;
    }
    uVar15 = 0;
    puVar12 = puVar3;
LAB_00102dc0:
    uVar17 = local_e8 & 7;
    uVar20 = uVar15;
    if (uVar17 != 0) {
      uVar22 = uVar15 | uVar17;
      do {
        uVar20 = uVar15;
        if (ringbuffer[uVar15 + uVar13] != *puVar12) break;
        puVar12 = puVar12 + 1;
        uVar15 = uVar15 + 1;
        uVar17 = uVar17 - 1;
        uVar20 = uVar22;
      } while (uVar17 != 0);
    }
LAB_001029f5:
    if ((uVar20 < 4) || (uVar13 = uVar20 * 0x87 + 0x78f, uVar13 < 0x7e5)) {
      local_e0 = 0;
      uVar20 = 0;
    }
    else {
      uVar23 = puVar3[uVar20];
      local_b8 = uVar13;
    }
  }
  else {
    local_e0 = 0;
    uVar20 = 0;
  }
  puVar24 = (uint *)(hasher + ((ulong)(*(long *)(ringbuffer + uVar32) * -0x42e1ca5843000000) >> 0x30
                              ) * 4 + 0x28);
  uVar13 = (ulong)((uint)local_e8 & 7);
  iVar18 = 0;
  do {
    uVar25 = *puVar24;
    uVar30 = local_68 & uVar25;
    if (((uVar23 == ringbuffer[uVar20 + uVar30]) && (sVar21 != uVar25)) &&
       (uVar15 = sVar21 - uVar25, uVar15 <= uVar19)) {
      if (7 < local_e8) {
        lVar16 = 0;
        uVar17 = 0;
LAB_001024a2:
        if (*(ulong *)(puVar3 + uVar17 * 8) == *(ulong *)(ringbuffer + uVar17 * 8 + (ulong)uVar30))
        goto code_r0x001024b0;
        uVar22 = *(ulong *)(ringbuffer + uVar17 * 8 + (ulong)uVar30) ^
                 *(ulong *)(puVar3 + uVar17 * 8);
        uVar17 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
          }
        }
        uVar17 = (uVar17 >> 3 & 0x1fffffff) - lVar16;
        goto LAB_001024ea;
      }
      uVar22 = 0;
      puVar12 = puVar3;
LAB_0010253f:
      uVar17 = uVar22;
      if (uVar13 != 0) {
        uVar28 = uVar13 | uVar22;
        uVar29 = uVar13;
        do {
          uVar17 = uVar22;
          if (ringbuffer[uVar22 + uVar30] != *puVar12) break;
          puVar12 = puVar12 + 1;
          uVar22 = uVar22 + 1;
          uVar29 = uVar29 - 1;
          uVar17 = uVar28;
        } while (uVar29 != 0);
      }
LAB_001024ea:
      if (3 < uVar17) {
        iVar6 = 0x1f;
        if ((uint)uVar15 != 0) {
          for (; (uint)uVar15 >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        uVar22 = (ulong)(iVar6 * -0x1e + 0x780) + uVar17 * 0x87;
        if (local_b8 < uVar22) {
          uVar23 = puVar3[uVar17];
          uVar20 = uVar17;
          local_e0 = uVar15;
          local_b8 = uVar22;
        }
      }
    }
    puVar24 = puVar24 + 1;
    bVar35 = iVar18 == 0;
    iVar18 = iVar18 + 1;
  } while (bVar35);
  *(uint *)(hasher + (ulong)(((uint)(ushort)((ulong)(*(long *)(ringbuffer + uVar32) *
                                                    -0x42e1ca5843000000) >> 0x30) +
                             (uint)(((uint)sVar21 >> 3 & 1) != 0)) * 4) + 0x28) = (uint)sVar21;
  if (0x7e4 < local_b8) {
    iVar18 = *dist_cache;
    uVar19 = (lVar4 + num_bytes) - sVar21;
    iVar6 = 0;
LAB_001025c6:
    local_e8 = local_e8 - 1;
    uVar32 = uVar20 - 1;
    if (local_e8 <= uVar20 - 1) {
      uVar32 = local_e8;
    }
    if (4 < params->quality) {
      uVar32 = 0;
    }
    uVar13 = sVar21 + 1;
    uVar34 = uVar31;
    if (uVar13 < uVar31) {
      uVar34 = uVar13;
    }
    puVar3 = ringbuffer + (uVar13 & ringbuffer_mask);
    uVar23 = puVar3[uVar32];
    uVar15 = uVar13 - (long)iVar18;
    local_c8 = 0x7e4;
    if ((uVar15 < uVar13) &&
       (uVar25 = (uint)uVar15 & local_68, uVar23 == ringbuffer[uVar32 + uVar25])) {
      if (7 < local_e8) {
        lVar16 = 0;
        uVar15 = 0;
LAB_00102660:
        if (*(ulong *)(puVar3 + uVar15 * 8) == *(ulong *)(ringbuffer + uVar15 * 8 + (ulong)uVar25))
        goto code_r0x0010266d;
        uVar17 = *(ulong *)(ringbuffer + uVar15 * 8 + (ulong)uVar25) ^
                 *(ulong *)(puVar3 + uVar15 * 8);
        uVar15 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
          }
        }
        uVar15 = (uVar15 >> 3 & 0x1fffffff) - lVar16;
        goto LAB_00102699;
      }
      uVar15 = 0;
      puVar12 = puVar3;
      goto LAB_001028c1;
    }
    goto LAB_001026d7;
  }
  local_f8 = local_f8 + 1;
  position = sVar21 + 1;
  if (uVar34 < position) {
    if ((uint)((int)lVar26 * 4) + uVar34 < position) {
      uVar19 = sVar21 + 0x11;
      if (uVar1 <= sVar21 + 0x11) {
        uVar19 = uVar1;
      }
      for (; position < uVar19; position = position + 4) {
        *(uint *)(hasher + (ulong)(((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                    (position & ringbuffer_mask)) *
                                                          -0x42e1ca5843000000) >> 0x30) +
                                   (uint)(((uint)position >> 3 & 1) != 0)) * 4) + 0x28) =
             (uint)position;
        local_f8 = local_f8 + 4;
      }
    }
    else {
      uVar19 = sVar21 + 9;
      if (uVar1 <= sVar21 + 9) {
        uVar19 = uVar1;
      }
      for (; position < uVar19; position = position + 2) {
        *(uint *)(hasher + (ulong)(((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                    (position & ringbuffer_mask)) *
                                                          -0x42e1ca5843000000) >> 0x30) +
                                   (uint)(((uint)position >> 3 & 1) != 0)) * 4) + 0x28) =
             (uint)position;
        local_f8 = local_f8 + 2;
      }
    }
  }
  goto LAB_00102d71;
code_r0x001023d7:
  uVar20 = uVar20 + 1;
  lVar16 = lVar16 + -8;
  if (local_e8 >> 3 == uVar20) goto LAB_00102dc0;
  goto LAB_001023c6;
code_r0x001024b0:
  uVar17 = uVar17 + 1;
  lVar16 = lVar16 + -8;
  uVar22 = local_e8 & 0xfffffffffffffff8;
  puVar12 = ringbuffer + (local_e8 & 0xfffffffffffffff8) + uVar32;
  if (local_e8 >> 3 == uVar17) goto LAB_0010253f;
  goto LAB_001024a2;
code_r0x0010266d:
  uVar15 = uVar15 + 1;
  lVar16 = lVar16 + -8;
  if (uVar19 >> 3 == uVar15) goto code_r0x0010267b;
  goto LAB_00102660;
code_r0x0010267b:
  uVar15 = -lVar16;
  puVar12 = puVar3 + -lVar16;
LAB_001028c1:
  uVar17 = local_e8 & 7;
  for (; (uVar17 != 0 && (ringbuffer[uVar15 + uVar25] == *puVar12)); uVar15 = uVar15 + 1) {
    puVar12 = puVar12 + 1;
    uVar17 = uVar17 - 1;
  }
LAB_00102699:
  if (uVar15 < 4) {
    local_d0 = 0;
  }
  else {
    uVar17 = uVar15 * 0x87 + 0x78f;
    if (uVar17 < 0x7e5) {
LAB_001026d7:
      local_d0 = 0;
    }
    else {
      uVar23 = puVar3[uVar15];
      uVar32 = uVar15;
      local_d0 = (long)iVar18;
      local_c8 = uVar17;
    }
  }
  puVar24 = (uint *)(hasher + ((ulong)(*(long *)(ringbuffer + (uVar13 & ringbuffer_mask)) *
                                      -0x42e1ca5843000000) >> 0x30) * 4 + 0x28);
  uVar15 = (ulong)((uint)local_e8 & 7);
  iVar27 = 0;
LAB_00102718:
  uVar25 = *puVar24;
  uVar30 = local_68 & uVar25;
  if (((uVar23 == ringbuffer[uVar32 + uVar30]) && (uVar13 != uVar25)) &&
     (uVar17 = uVar13 - uVar25, uVar17 <= uVar34)) {
    uVar22 = uVar15;
    if (7 < local_e8) {
      lVar16 = 0;
      uVar29 = 0;
LAB_00102759:
      if (*(ulong *)(puVar3 + uVar29 * 8) == *(ulong *)(ringbuffer + uVar29 * 8 + (ulong)uVar30))
      goto code_r0x00102766;
      uVar29 = *(ulong *)(ringbuffer + uVar29 * 8 + (ulong)uVar30) ^ *(ulong *)(puVar3 + uVar29 * 8)
      ;
      uVar22 = 0;
      if (uVar29 != 0) {
        for (; (uVar29 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
        }
      }
      uVar29 = (uVar22 >> 3 & 0x1fffffff) - lVar16;
      goto LAB_00102790;
    }
    uVar29 = 0;
    puVar12 = puVar3;
    goto joined_r0x001027f3;
  }
  goto LAB_001027d0;
code_r0x00102766:
  uVar29 = uVar29 + 1;
  lVar16 = lVar16 + -8;
  if (uVar19 >> 3 == uVar29) goto code_r0x00102774;
  goto LAB_00102759;
code_r0x00102774:
  uVar29 = -lVar16;
  puVar12 = puVar3 + -lVar16;
joined_r0x001027f3:
  for (; (uVar22 != 0 && (ringbuffer[uVar29 + uVar30] == *puVar12)); uVar29 = uVar29 + 1) {
    puVar12 = puVar12 + 1;
    uVar22 = uVar22 - 1;
  }
LAB_00102790:
  if (3 < uVar29) {
    iVar7 = 0x1f;
    if ((uint)uVar17 != 0) {
      for (; (uint)uVar17 >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    uVar22 = (ulong)(iVar7 * -0x1e + 0x780) + uVar29 * 0x87;
    if (local_c8 < uVar22) {
      uVar23 = puVar3[uVar29];
      uVar32 = uVar29;
      local_d0 = uVar17;
      local_c8 = uVar22;
    }
  }
LAB_001027d0:
  puVar24 = puVar24 + 1;
  bVar35 = iVar27 != 0;
  iVar27 = iVar27 + 1;
  if (bVar35) goto LAB_0010280e;
  goto LAB_00102718;
LAB_0010280e:
  *(uint *)(hasher + (ulong)(((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                              (uVar13 & ringbuffer_mask)) *
                                                    -0x42e1ca5843000000) >> 0x30) +
                             (uint)(((uint)uVar13 >> 3 & 1) != 0)) * 4) + 0x28) = (uint)uVar13;
  bVar35 = local_b8 + 0xaf <= local_c8;
  uVar34 = sVar21;
  iVar27 = iVar6;
  if (bVar35) {
    local_f8 = local_f8 + 1;
    local_b8 = local_c8;
    local_e0 = local_d0;
    uVar34 = uVar13;
    uVar20 = uVar32;
    iVar27 = iVar6 + 1;
  }
  bVar5 = 2 < iVar6;
  uVar32 = sVar21 + 9;
  uVar19 = uVar19 - 1;
  sVar21 = uVar34;
  iVar6 = iVar27;
  if (!bVar35 || (bVar5 || uVar2 <= uVar32)) goto LAB_00102989;
  goto LAB_001025c6;
LAB_00102989:
  uVar19 = uVar31;
  if (uVar34 < uVar31) {
    uVar19 = uVar34;
  }
  if (local_e0 <= uVar19) {
    uVar25 = 0;
    bVar35 = false;
    if (local_e0 != (long)*dist_cache) {
      if (local_e0 == (long)dist_cache[1]) {
        uVar25 = 1;
LAB_001029ce:
        bVar35 = false;
      }
      else {
        uVar32 = (local_e0 + 3) - (long)*dist_cache;
        if (uVar32 < 7) {
          iVar18 = (int)uVar32;
          uVar25 = 0x9750468;
        }
        else {
          uVar32 = (local_e0 + 3) - (long)dist_cache[1];
          if (6 < uVar32) {
            if (local_e0 != (long)dist_cache[2]) {
              bVar35 = local_e0 != (long)dist_cache[3];
              uVar25 = 3;
              goto LAB_00102ad7;
            }
            uVar25 = 2;
            goto LAB_001029ce;
          }
          iVar18 = (int)uVar32;
          uVar25 = 0xfdb1ace;
        }
        uVar25 = uVar25 >> ((byte)(iVar18 << 2) & 0x1f) & 0xf;
        bVar35 = false;
      }
    }
LAB_00102ad7:
    if (!bVar35) {
      uVar32 = (ulong)uVar25;
      goto LAB_00102ae3;
    }
  }
  uVar32 = local_e0 + 0xf;
LAB_00102ae3:
  if ((local_e0 <= uVar19) && (uVar32 != 0)) {
    dist_cache[3] = dist_cache[2];
    *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
    *dist_cache = (int)local_e0;
  }
  local_c0->insert_len_ = (uint32_t)local_f8;
  uVar33 = (uint32_t)uVar20;
  local_c0->copy_len_ = uVar33;
  uVar13 = (ulong)(params->dist).num_direct_distance_codes;
  uVar19 = uVar13 + 0x10;
  if (uVar32 < uVar19) {
    local_c0->dist_prefix_ = (uint16_t)uVar32;
    uVar10 = 0;
  }
  else {
    uVar10 = (params->dist).distance_postfix_bits;
    bVar14 = (byte)uVar10;
    uVar32 = ((uVar32 - uVar13) + (4L << (bVar14 & 0x3f))) - 0x10;
    uVar25 = 0x1f;
    if ((uint)uVar32 != 0) {
      for (; (uint)uVar32 >> uVar25 == 0; uVar25 = uVar25 - 1) {
      }
    }
    uVar25 = (uVar25 ^ 0xffffffe0) + 0x1f;
    bVar35 = (uVar32 >> ((ulong)uVar25 & 0x3f) & 1) != 0;
    iVar18 = uVar25 - uVar10;
    local_c0->dist_prefix_ =
         (short)((uint)bVar35 + iVar18 * 2 + 0xfffe << (bVar14 & 0x3f)) +
         (short)uVar19 + (~(ushort)(-1 << (bVar14 & 0x1f)) & (ushort)uVar32) | (short)iVar18 * 0x400
    ;
    uVar10 = (uint32_t)(uVar32 - ((ulong)bVar35 + 2 << ((byte)uVar25 & 0x3f)) >> (bVar14 & 0x3f));
  }
  local_c0->dist_extra_ = uVar10;
  if (local_f8 < 6) {
    uVar19 = local_f8 & 0xffffffff;
  }
  else if (local_f8 < 0x82) {
    uVar25 = 0x1f;
    uVar30 = (uint)(local_f8 - 2);
    if (uVar30 != 0) {
      for (; uVar30 >> uVar25 == 0; uVar25 = uVar25 - 1) {
      }
    }
    uVar19 = (ulong)((int)(local_f8 - 2 >> ((char)(uVar25 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar25 ^ 0xffffffe0) * 2 + 0x40);
  }
  else if (local_f8 < 0x842) {
    uVar30 = (uint32_t)local_f8 - 0x42;
    uVar25 = 0x1f;
    if (uVar30 != 0) {
      for (; uVar30 >> uVar25 == 0; uVar25 = uVar25 - 1) {
      }
    }
    uVar19 = (ulong)((uVar25 ^ 0xffe0) + 0x2a);
  }
  else {
    uVar19 = 0x15;
    if (0x1841 < local_f8) {
      uVar19 = (ulong)(ushort)(0x17 - (local_f8 < 0x5842));
    }
  }
  uVar32 = (ulong)(int)uVar33;
  if (uVar32 < 10) {
    uVar25 = uVar33 - 2;
  }
  else if (uVar32 < 0x86) {
    uVar25 = 0x1f;
    uVar30 = (uint)(uVar32 - 6);
    if (uVar30 != 0) {
      for (; uVar30 >> uVar25 == 0; uVar25 = uVar25 - 1) {
      }
    }
    uVar25 = (int)(uVar32 - 6 >> ((char)(uVar25 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar25 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar25 = 0x17;
    if (uVar32 < 0x846) {
      uVar25 = 0x1f;
      if (uVar33 - 0x46 != 0) {
        for (; uVar33 - 0x46 >> uVar25 == 0; uVar25 = uVar25 - 1) {
        }
      }
      uVar25 = (uVar25 ^ 0xffe0) + 0x2c;
    }
  }
  uVar8 = (ushort)uVar25;
  uVar9 = (uVar8 & 7) + ((ushort)uVar19 & 7) * 8;
  if ((((local_c0->dist_prefix_ & 0x3ff) == 0) && ((ushort)uVar19 < 8)) && (uVar8 < 0x10)) {
    if (7 < uVar8) {
      uVar9 = uVar9 | 0x40;
    }
  }
  else {
    iVar18 = (int)((uVar19 & 0xffff) >> 3) * 3 + ((uVar25 & 0xffff) >> 3);
    uVar9 = uVar9 + ((ushort)(0x520d40 >> ((char)iVar18 * '\x02' & 0x1fU)) & 0xc0) +
                    (short)iVar18 * 0x40 + 0x40;
  }
  local_c0->cmd_prefix_ = uVar9;
  *num_literals = *num_literals + local_f8;
  position = uVar34 + uVar20;
  uVar19 = uVar11;
  if (position < uVar11) {
    uVar19 = position;
  }
  uVar32 = uVar34 + 2;
  if (local_e0 < uVar20 >> 2) {
    uVar13 = position + local_e0 * -4;
    if (uVar13 < uVar32) {
      uVar13 = uVar32;
    }
    uVar32 = uVar13;
    if (uVar19 < uVar13) {
      uVar32 = uVar19;
    }
  }
  uVar34 = lVar26 + uVar20 * 2 + uVar34;
  local_c0 = local_c0 + 1;
  if (uVar32 < uVar19) {
    do {
      *(uint *)(hasher + (ulong)(((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                  (uVar32 & ringbuffer_mask)) *
                                                        -0x42e1ca5843000000) >> 0x30) +
                                 (uint)(((uint)uVar32 >> 3 & 1) != 0)) * 4) + 0x28) = (uint)uVar32;
      uVar32 = uVar32 + 1;
    } while (uVar19 != uVar32);
  }
  local_f8 = 0;
LAB_00102d71:
  sVar21 = position;
  if (uVar2 <= position + 8) goto LAB_00102dfa;
  goto LAB_0010233f;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}